

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parse_path.cpp
# Opt level: O3

idx_t duckdb::FindLast(char *data_ptr,idx_t input_size,string *sep_data)

{
  idx_t iVar1;
  long lVar2;
  
  if (input_size == 0) {
    iVar1 = 0xffffffffffffffff;
  }
  else {
    lVar2 = 0;
    do {
      iVar1 = Find(data_ptr,input_size,sep_data);
      if ((iVar1 == 0xffffffffffffffff) || (input_size < iVar1)) break;
      lVar2 = lVar2 + iVar1 + 1;
      data_ptr = data_ptr + iVar1 + 1;
      input_size = input_size - (iVar1 + 1);
    } while (input_size != 0);
    iVar1 = lVar2 - 1;
  }
  return iVar1;
}

Assistant:

static idx_t FindLast(const char *data_ptr, idx_t input_size, const string &sep_data) {
	idx_t start = 0;
	while (input_size > 0) {
		auto pos = Find(data_ptr, input_size, sep_data);
		if (!IsIdxValid(pos, input_size)) {
			break;
		}
		start += (pos + 1);
		data_ptr += (pos + 1);
		input_size -= (pos + 1);
	}
	if (start < 1) {
		return DConstants::INVALID_INDEX;
	}
	return start - 1;
}